

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeTest_TestExternalResizeWorks4Threads_Test::TestBody
          (ResizeTest_TestExternalResizeWorks4Threads_Test *this)

{
  bool bVar1;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  uint expected_h;
  uint expected_w;
  uint frame;
  FrameInfo *info;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *__range1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  ResizingVideoSource video;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *in_stack_fffffffffffffe58;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  ResizingVideoSource *in_stack_fffffffffffffe70;
  Message *in_stack_fffffffffffffe78;
  int line;
  Message *in_stack_fffffffffffffe80;
  Message *in_stack_fffffffffffffe88;
  Type type;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe90;
  Message *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_118 [2];
  AssertionResult local_f8;
  undefined1 local_e4 [8];
  uint local_dc;
  reference local_d8;
  FrameInfo *local_d0;
  __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
  local_c8;
  long local_c0;
  uint local_a4;
  size_type local_a0;
  AssertionResult local_98 [2];
  uint local_74;
  HasNewFatalFailureHelper local_70;
  DummyVideoSource local_48;
  byte local_17;
  
  ResizingVideoSource::ResizingVideoSource
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  local_48._44_4_ = 0;
  local_17 = 1;
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0x280;
  *(undefined4 *)(in_RDI + 0x4c) = 0x1e0;
  *(undefined4 *)(in_RDI + 0x34) = 4;
  *(undefined4 *)(in_RDI + 0xf0) = 0x28;
  *(undefined4 *)(in_RDI + 0xec) = 0x28;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  bVar1 = testing::internal::AlwaysTrue();
  type = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe90)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (**(code **)(*(long *)(in_RDI + 0x18) + 0x10))(in_RDI + 0x18,&local_48);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_70);
    if (bVar1) {
      local_74 = 2;
    }
    else {
      local_74 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (in_stack_fffffffffffffe60);
    type = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    if (local_74 == 0) {
      local_a0 = std::
                 vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                 ::size((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                         *)(in_RDI + 0x3f8));
      local_a4 = libaom_test::DummyVideoSource::limit(&local_48);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (uint *)in_stack_fffffffffffffe60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_98);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        testing::AssertionResult::failure_message((AssertionResult *)0x8d7e2d);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe90,
                   (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   (char *)in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20)
                   ,(char *)in_stack_fffffffffffffe70);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
        testing::Message::~Message((Message *)0x8d7e8a);
      }
      local_74 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8d7f11);
      if (local_74 == 0) {
        local_c0 = in_RDI + 0x3f8;
        local_c8._M_current =
             (FrameInfo *)
             std::
             vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
             ::begin(in_stack_fffffffffffffe58);
        local_d0 = (FrameInfo *)
                   std::
                   vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                   ::end(in_stack_fffffffffffffe58);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                                   *)in_stack_fffffffffffffe60,
                                  (__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                                   *)in_stack_fffffffffffffe58), bVar1) {
          local_d8 = __gnu_cxx::
                     __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                     ::operator*(&local_c8);
          local_dc = (uint)local_d8->pts;
          in_stack_fffffffffffffe60 = (HasNewFatalFailureHelper *)local_e4;
          in_stack_fffffffffffffe58 =
               (vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                *)(local_e4 + 4);
          ScaleForFrameNumber(local_dc,0x280,0x1e0,local_48._44_4_,false,(bool)(local_17 & 1),
                              (uint *)in_stack_fffffffffffffe58,(uint *)in_stack_fffffffffffffe60);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                     (uint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (uint *)in_stack_fffffffffffffe60);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe90);
            testing::Message::operator<<
                      ((Message *)in_stack_fffffffffffffe60,(char (*) [7])in_stack_fffffffffffffe58)
            ;
            testing::Message::operator<<
                      ((Message *)in_stack_fffffffffffffe60,(uint *)in_stack_fffffffffffffe58);
            testing::Message::operator<<
                      ((Message *)in_stack_fffffffffffffe60,(char (*) [22])in_stack_fffffffffffffe58
                      );
            in_stack_fffffffffffffe90 =
                 (HasNewFatalFailureHelper *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x8d80af);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe90,
                       (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                       (char *)in_stack_fffffffffffffe80,
                       (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       (char *)in_stack_fffffffffffffe70);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe60);
            testing::Message::~Message((Message *)0x8d8109);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x8d8177);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                     (uint *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (uint *)in_stack_fffffffffffffe60);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe90);
            in_stack_fffffffffffffe88 =
                 testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffe60,
                            (char (*) [7])in_stack_fffffffffffffe58);
            in_stack_fffffffffffffe80 =
                 testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffe60,(uint *)in_stack_fffffffffffffe58);
            in_stack_fffffffffffffe78 =
                 testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffe60,
                            (char (*) [23])in_stack_fffffffffffffe58);
            in_stack_fffffffffffffe70 =
                 (ResizingVideoSource *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x8d823a);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe90,
                       (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                       (char *)in_stack_fffffffffffffe80,
                       (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       (char *)in_stack_fffffffffffffe70);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe60);
            testing::Message::~Message((Message *)0x8d8294);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x8d82ff);
          __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
          ::operator++(&local_c8);
        }
        local_74 = 0;
      }
      goto LAB_008d832b;
    }
    if (local_74 != 2) goto LAB_008d832b;
  }
  line = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe90);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe90,type,(char *)in_stack_fffffffffffffe80,line,
             (char *)in_stack_fffffffffffffe70);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
  testing::Message::~Message((Message *)0x8d7d46);
  local_74 = 1;
LAB_008d832b:
  ResizingVideoSource::~ResizingVideoSource((ResizingVideoSource *)0x8d8338);
  return;
}

Assistant:

TEST_P(ResizeTest, TestExternalResizeWorks4Threads) {
  ResizingVideoSource video(640, 480);
  video.flag_codec_ = 0;
  video.random_input_one_half_only_ = true;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_forced_max_frame_width = 640;
  cfg_.g_forced_max_frame_height = 480;
  cfg_.g_threads = 4;
  cfg_.kf_max_dist = 40;
  cfg_.kf_min_dist = 40;
  cfg_.rc_dropframe_thresh = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  // Check we decoded the same number of frames as we attempted to encode
  ASSERT_EQ(frame_info_list_.size(), video.limit());

  for (const auto &info : frame_info_list_) {
    const unsigned int frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w;
    unsigned int expected_h;
    ScaleForFrameNumber(frame, 640, 480, video.flag_codec_, false,
                        video.random_input_one_half_only_, &expected_w,
                        &expected_h);
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
  }
#endif
}